

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

ostream * pstack::operator<<(ostream *os,
                            JSON<pstack::Field<char[13],_pstack::DumpCFAInsns>,_const_pstack::Dwarf::CFI_*>
                            *o)

{
  DumpCFAInsns *pDVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  JSON<char[13],_char> local_a0;
  DWARFReader local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> local_48;
  char local_31;
  
  local_a0.object = o->object->k;
  local_a0.context = &local_31;
  local_31 = '\0';
  poVar3 = operator<<(os,&local_a0);
  poVar3 = std::operator<<(poVar3,":");
  pDVar1 = o->object->v;
  std::__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,(__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> *)*o->context
            );
  local_90.off = pDVar1->start;
  local_90.end = pDVar1->end;
  if (local_90.end == 0xffffffffffffffff) {
    iVar2 = (*(local_48._M_ptr)->_vptr_Reader[8])();
    local_90.end = CONCAT44(extraout_var,iVar2);
  }
  local_90.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48._M_ptr;
  local_90.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_48._M_refcount._M_pi;
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90.addrLen = 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::operator<<(poVar3,"[ ");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  while (local_90.off != local_90.end) {
    std::operator<<(poVar3,(string *)&local_68);
    dumpCFAInsn(poVar3,&local_90);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&local_68,",\n");
  }
  std::operator<<(poVar3,"]");
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return poVar3;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}